

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O1

MatrixXd * __thiscall
VehicleState::Propagator::GetRangeAndRateJac
          (MatrixXd *__return_storage_ptr__,Propagator *this,Vector3d *pos_station_ecef)

{
  undefined8 *puVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  Matrix3d R_ecef2eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_148;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  Matrix3d local_78;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_128 = this->t_JD_;
  dVar5 = this->t_;
  local_108 = this->earthrotationspeed_;
  dStack_100 = 0.0;
  local_f8 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
  dStack_f0 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
  dVar4 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2];
  local_e8 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
  dStack_e0 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
  local_d0 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2];
  local_148.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x120);
  local_148.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)((local_148.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar3) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_148.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar3 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_148.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar3 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_148.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar3 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_148.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar3 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_148.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar3 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_148.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar3 + 0x40) = 0x3ff0000000000000;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x120);
  local_148.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  Util::ECEF2ECI(&local_78,local_128 + dVar5 / 86400.0,this->gravmodel_->nut80ptr_,
                 this->gravmodel_->iau1980ptr_,&local_148);
  local_c8 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0];
  dStack_c0 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[1];
  local_128 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[2];
  dStack_120 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
  local_b8 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[3];
  dStack_b0 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[4];
  local_118 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
              m_storage.m_data.array[0];
  dStack_110 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
               m_storage.m_data.array[1];
  local_a8 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[6];
  dStack_a0 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[7];
  local_88 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
             m_storage.m_data.array[2];
  uStack_80 = 0;
  local_98 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[5];
  uStack_90 = 0;
  local_30 = 2;
  local_28 = 6;
  local_20 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_30);
  dVar5 = local_a8 * local_88 + local_b8 * dStack_110 + local_c8 * local_118;
  dVar6 = dStack_a0 * local_88 + dStack_b0 * dStack_110 + dStack_c0 * local_118;
  local_f8 = local_f8 - dVar5;
  dStack_100 = dStack_f0 - dVar6;
  local_e8 = local_e8 - -local_108 * dVar6;
  dStack_e0 = dStack_e0 - local_108 * dVar5;
  dVar4 = dVar4 - (local_98 * dStack_110 +
                   local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[8] * local_88 + local_128 * local_118);
  local_128 = local_f8 * local_f8;
  dStack_120 = dStack_100 * dStack_100;
  dVar6 = dVar4 * dVar4;
  dVar5 = SQRT(dStack_120 + local_128 + dVar6);
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  *pdVar2 = local_f8 / dVar5;
  lVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar2[lVar3] = dStack_100 / dVar5;
  pdVar2[lVar3 * 2] = dVar4 / dVar5;
  local_118 = dStack_100 * dStack_100;
  dStack_110 = dStack_100;
  local_108 = dStack_100;
  dStack_f0 = dStack_100;
  dVar5 = pow(local_128 + local_118 + dVar6,1.5);
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  pdVar2[1] = ((local_e8 * dVar6 + (local_e8 * local_118 - dStack_e0 * local_f8 * local_108)) -
              local_d0 * local_f8 * dVar4) / dVar5;
  lVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar2[lVar3 + 1] =
       ((dVar6 * dStack_e0 + (local_128 * dStack_e0 - local_e8 * local_108 * local_f8)) -
       local_d0 * local_108 * dVar4) / dVar5;
  pdVar2[lVar3 * 2 + 1] =
       (((local_118 * local_d0 - local_e8 * dVar4 * local_f8) + local_118 * local_d0) -
       dStack_e0 * dVar4 * local_108) / dVar5;
  pdVar2[lVar3 * 3 + 1] = *pdVar2;
  pdVar2[lVar3 * 4 + 1] = pdVar2[lVar3];
  pdVar2[lVar3 * 5 + 1] = pdVar2[lVar3 * 2];
  if (local_148.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Propagator::GetRangeAndRateJac(Eigen::Vector3d pos_station_ecef){

		//locals
		double JD_UTC = this->t_JD_ + this->t_/(24.0*60.0*60.0); //current UTC Julian Date in days
		double earthrot = this->earthrotationspeed_;
		Eigen::Vector3d pos_craft = this->pos_;
		Eigen::Vector3d vel_craft = this->vel_;
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = Util::ECEF2ECI(JD_UTC, this->gravmodel_->nut80ptr_, this->gravmodel_->iau1980ptr_, &matvec); //matrix rotating from ECEF2ECI

		//convert station position to ECI
		Eigen::Vector3d pos_station = R_ecef2eci*pos_station_ecef;

		//station ECI velocity
		Eigen::Vector3d vel_station;
		vel_station[0] = -1.0*earthrot*pos_station[1];
		vel_station[1] = earthrot*pos_station[0];
		vel_station[2] = 0.0;

		//relative position and velocity
		Eigen::Vector3d rel_pos = pos_craft - pos_station;
		Eigen::Vector3d rel_vel  = vel_craft - vel_station;

		//initialize H
		Eigen::MatrixXd H = Eigen::MatrixXd::Zero(2,6);

		//range partials
		H(0,0) = rel_pos[0]/rel_pos.norm();
		H(0,1) = rel_pos[1]/rel_pos.norm();
		H(0,2) = rel_pos[2]/rel_pos.norm();

		//range rate partials
		double rel32 = pow(pow(rel_pos[0],2.0) + pow(rel_pos[1],2.0) + pow(rel_pos[2],2.0), 1.5);
		H(1,0) = (rel_vel[0]*pow(rel_pos[1],2.0) - rel_pos[0]*rel_vel[1]*rel_pos[1] + rel_vel[0]*pow(rel_pos[2],2.0) - rel_pos[0]*rel_vel[2]*rel_pos[2])/rel32;
		H(1,1) = (rel_vel[1]*pow(rel_pos[0],2.0) - rel_pos[1]*rel_vel[0]*rel_pos[0] + rel_vel[1]*pow(rel_pos[2],2.0) - rel_pos[1]*rel_vel[2]*rel_pos[2])/rel32;
		H(1,2) = (rel_vel[2]*pow(rel_pos[1],2.0) - rel_pos[2]*rel_vel[0]*rel_pos[0] + rel_vel[2]*pow(rel_pos[1],2.0) - rel_pos[2]*rel_vel[1]*rel_pos[1])/rel32;
		H(1,3) = H(0,0);
		H(1,4) = H(0,1);
		H(1,5) = H(0,2);

		return H;
	}